

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O2

Alignment * __thiscall
spoa::SisdAlignmentEngine::Linear
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  pointer ppEVar1;
  char cVar2;
  AlignmentType AVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  int32_t *piVar6;
  Implementation *pIVar7;
  Node *pNVar8;
  pointer ppNVar9;
  uint uVar10;
  pointer ppNVar11;
  long lVar12;
  int iVar13;
  undefined4 in_register_00000014;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint64_t j_2;
  ulong uVar22;
  uint64_t j;
  ulong uVar23;
  int iVar24;
  uint64_t j_1;
  ulong uVar25;
  ulong uVar26;
  uint32_t local_70;
  uint32_t local_6c;
  int32_t *local_68;
  long local_60;
  Implementation *local_58;
  pointer local_50;
  ulong local_48;
  Node *local_40;
  pointer local_38;
  
  local_48 = CONCAT44(in_register_00000014,sequence_len);
  AVar3 = (this->super_AlignmentEngine).type_;
  local_50 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_58 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
  ;
  uVar18 = (ulong)(sequence_len + 1);
  uVar15 = 0x80000400;
  if (AVar3 == kSW) {
    uVar15 = 0;
  }
  local_60 = 2 - uVar18;
  uVar17 = 0;
  uVar25 = 0;
  ppNVar9 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppNVar11 = ppNVar9, ppNVar11 != local_50) {
    local_40 = *ppNVar11;
    lVar12 = *(long *)&(local_58->node_id_to_rank).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    ppEVar4 = (local_40->inedges).
              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar5 = (local_40->inedges).
              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppEVar4 == ppEVar5) {
      uVar22 = 0;
    }
    else {
      uVar22 = (ulong)(*(int *)(lVar12 + (ulong)(*ppEVar4)->tail->id * 4) + 1);
    }
    piVar6 = local_58->H;
    lVar21 = local_40->code * uVar18 * 4 +
             *(long *)&(local_58->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl;
    uVar19 = *(int *)(lVar12 + (ulong)local_40->id * 4) + 1;
    lVar20 = uVar19 * uVar18;
    cVar2 = (this->super_AlignmentEngine).g_;
    for (uVar23 = 1; uVar23 < uVar18; uVar23 = uVar23 + 1) {
      iVar24 = *(int *)(lVar21 + uVar23 * 4) + piVar6[uVar22 * uVar18 + (uVar23 - 1)];
      iVar14 = piVar6[uVar22 * uVar18 + uVar23] + (int)cVar2;
      if (iVar14 < iVar24) {
        iVar14 = iVar24;
      }
      piVar6[lVar20 + uVar23] = iVar14;
    }
    for (uVar22 = 1; uVar22 < (ulong)((long)ppEVar5 - (long)ppEVar4 >> 3);
        uVar22 = (ulong)((int)uVar22 + 1)) {
      cVar2 = (this->super_AlignmentEngine).g_;
      lVar16 = (*(int *)(lVar12 + (ulong)ppEVar4[uVar22]->tail->id * 4) + 1) * uVar18;
      for (uVar23 = 1; uVar23 < uVar18; uVar23 = uVar23 + 1) {
        iVar24 = *(int *)(lVar21 + uVar23 * 4) + piVar6[lVar16 + (uVar23 - 1)];
        iVar14 = piVar6[lVar16 + uVar23] + (int)cVar2;
        if (iVar14 < piVar6[lVar20 + uVar23]) {
          iVar14 = piVar6[lVar20 + uVar23];
        }
        if (iVar14 < iVar24) {
          iVar14 = iVar24;
        }
        piVar6[lVar20 + uVar23] = iVar14;
      }
    }
    cVar2 = (this->super_AlignmentEngine).g_;
    for (uVar22 = 1; uVar22 < uVar18; uVar22 = uVar22 + 1) {
      uVar10 = piVar6[lVar20 + (uVar22 - 1)] + (int)cVar2;
      if ((int)uVar10 <= piVar6[lVar20 + uVar22]) {
        uVar10 = piVar6[lVar20 + uVar22];
      }
      piVar6[lVar20 + uVar22] = uVar10;
      if (AVar3 == kOV) {
        if ((local_40->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (local_40->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_0011e6d6:
          if ((int)uVar15 < (int)uVar10) {
            uVar17 = (ulong)uVar19;
            uVar25 = uVar22 & 0xffffffff;
            uVar15 = uVar10;
          }
        }
      }
      else if (AVar3 == kNW) {
        if (((local_60 + uVar22 == 1) &&
            ((local_40->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (local_40->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish)) && ((int)uVar15 < piVar6[lVar20 + (uVar18 - 1)])) {
          uVar17 = (ulong)uVar19;
          uVar25 = local_48;
          uVar15 = piVar6[lVar20 + (uVar18 - 1)];
        }
      }
      else if (AVar3 == kSW) {
        uVar10 = ~((int)uVar10 >> 0x1f) & uVar10;
        piVar6[lVar20 + uVar22] = uVar10;
        goto LAB_0011e6d6;
      }
    }
    local_38 = ppNVar11;
    ppNVar9 = ppNVar11 + 1;
  }
  if ((int)uVar17 == 0 && (int)uVar25 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar15;
  }
  uVar22 = 0;
  uVar15 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = score;
  do {
    uVar19 = (uint)uVar17;
    iVar14 = (int)uVar25;
    uVar23 = uVar25 & 0xffffffff;
    if (AVar3 == kOV) {
      iVar24 = iVar14;
      if (uVar19 == 0) goto LAB_0011e9ad;
joined_r0x0011e790:
      if (iVar24 == 0) goto LAB_0011e9ad;
    }
    else {
      if (AVar3 != kNW) {
        if (AVar3 == kSW) {
          iVar24 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar17 * uVar18 + uVar23];
          goto joined_r0x0011e790;
        }
LAB_0011e9ad:
        std::
        __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        return __return_storage_ptr__;
      }
      if (uVar19 == 0 && iVar14 == 0) goto LAB_0011e9ad;
    }
    lVar12 = uVar17 * uVar18;
    uVar10 = (uint)uVar22;
    pIVar7 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    piVar6 = pIVar7->H;
    iVar24 = piVar6[lVar12 + uVar23];
    if ((iVar14 == 0) || (uVar19 == 0)) {
LAB_0011e878:
      if (uVar19 == 0) {
LAB_0011e883:
        if (iVar24 == (int)(this->super_AlignmentEngine).g_ + piVar6[lVar12 + (uVar23 - 1)]) {
          uVar15 = uVar19;
          uVar10 = iVar14 - 1;
        }
        uVar22 = (ulong)uVar10;
        uVar17 = (ulong)uVar15;
      }
      else {
        pNVar8 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
        ppEVar4 = (pNVar8->inedges).
                  super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppEVar5 = *(pointer *)
                   ((long)&(pNVar8->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl + 8);
        if (ppEVar4 == ppEVar5) {
          uVar17 = 0;
        }
        else {
          uVar17 = (ulong)(*(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar4)->tail->id * 4) + 1);
        }
        uVar22 = uVar25 & 0xffffffff;
        iVar13 = (int)(this->super_AlignmentEngine).g_;
        if (iVar24 != piVar6[uVar17 * uVar18 + uVar23] + iVar13) {
          uVar22 = 1;
          do {
            if ((ulong)((long)ppEVar5 - (long)ppEVar4 >> 3) <= uVar22) goto LAB_0011e883;
            ppEVar1 = ppEVar4 + uVar22;
            uVar22 = (ulong)((int)uVar22 + 1);
            uVar17 = (ulong)(*(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)(*ppEVar1)->tail->id * 4) + 1);
          } while (iVar24 != piVar6[uVar23 + uVar17 * uVar18] + iVar13);
          uVar22 = uVar25 & 0xffffffff;
        }
      }
    }
    else {
      pNVar8 = (graph->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar19 - 1];
      ppEVar4 = (pNVar8->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppEVar5 = *(pointer *)
                 ((long)&(pNVar8->inedges).
                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                         ._M_impl + 8);
      if (ppEVar4 == ppEVar5) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)(*(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                 + (ulong)(*ppEVar4)->tail->id * 4) + 1);
      }
      uVar22 = (ulong)(iVar14 - 1);
      iVar13 = *(int *)(pNVar8->code * uVar18 * 4 +
                        *(long *)&(pIVar7->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar23 * 4
                       );
      if (iVar24 != piVar6[uVar17 * uVar18 + uVar22] + iVar13) {
        uVar26 = 1;
        do {
          if ((ulong)((long)ppEVar5 - (long)ppEVar4 >> 3) <= uVar26) goto LAB_0011e878;
          ppEVar1 = ppEVar4 + uVar26;
          uVar26 = (ulong)((int)uVar26 + 1);
          uVar17 = (ulong)(*(int *)(*(long *)&(pIVar7->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)(*ppEVar1)->tail->id * 4) + 1);
        } while (iVar24 != piVar6[uVar22 + uVar17 * uVar18] + iVar13);
      }
    }
    uVar15 = (uint)uVar17;
    local_6c = 0xffffffff;
    if (uVar19 != uVar15) {
      local_6c = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar19 - 1]->id;
    }
    local_70 = iVar14 - 1;
    if (iVar14 == (int)uVar22) {
      local_70 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_6c,&local_70);
    AVar3 = (this->super_AlignmentEngine).type_;
    uVar25 = uVar22;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    // update H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(
          H_pred_row[j - 1] + char_profile[j],
          H_pred_row[j] + g_);
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        H_row[j] = std::max(
            H_pred_row[j - 1] + char_profile[j],
            std::max(
                H_row[j],
                H_pred_row[j] + g_));
      }
    }

    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      H_row[j] = std::max(H_row[j - 1] + g_, H_row[j]);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          it->outedges.empty() && j == matrix_width - 1) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;
  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
          pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
          pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          std::uint32_t pred_i =
              pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + j] + g_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && H_ij == pimpl_->H[i * matrix_width + j - 1] + g_) {  // NOLINT
      prev_i = i;
      prev_j = j - 1;
      predecessor_found = true;
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}